

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.h
# Opt level: O0

void __thiscall
TransitionObservationIndependentMADPDiscrete::IndividualToJointActionIndices
          (TransitionObservationIndependentMADPDiscrete *this)

{
  Scope *in_stack_00000060;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000068;
  TransitionObservationIndependentMADPDiscrete *in_stack_00000070;
  
  IndividualToJointActionIndices(in_stack_00000070,in_stack_00000068,in_stack_00000060);
  return;
}

Assistant:

Index IndividualToJointActionIndices(
        const std::vector<Index>& ja_e, const Scope& agSC) const
        {
            // identical to MADPComponentDiscreteActions
            std::vector<size_t> nr_A_e(agSC.size());
            IndexTools::RestrictIndividualIndicesToScope(
                GetNrActions(), agSC, nr_A_e);
            Index jaI = IndexTools::IndividualToJointIndices( ja_e, nr_A_e);
            return(jaI);
        }